

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputBuffer.cpp
# Opt level: O1

void __thiscall antlr::InputBuffer::fill(InputBuffer *this,uint amount)

{
  pointer __src;
  pointer piVar1;
  ulong uVar2;
  iterator __position;
  int iVar3;
  undefined8 in_RAX;
  ulong uVar4;
  size_t sVar5;
  ulong uVar6;
  size_t __n;
  pointer piVar7;
  undefined8 uStack_28;
  
  uVar6 = (ulong)this->numToConsume;
  uStack_28 = in_RAX;
  if (uVar6 != 0) {
    if (this->nMarkers == 0) {
      piVar7 = (this->queue).storage.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar1 = (this->queue).storage.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      uVar2 = (this->queue).m_offset;
      uVar4 = ((long)piVar1 - (long)piVar7 >> 2) - uVar2;
      if (uVar6 <= uVar4) {
        uVar4 = uVar6;
      }
      if (uVar2 < 5000) {
        sVar5 = uVar4 + uVar2;
      }
      else {
        __src = piVar7 + uVar2 + uVar4;
        if (piVar7 != __src) {
          __n = (long)piVar1 - (long)__src;
          if (__n != 0) {
            memmove(piVar7,__src,__n);
          }
          piVar1 = (this->queue).storage.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          piVar7 = (pointer)((long)piVar7 + ((long)piVar1 - (long)__src));
          if (piVar1 != piVar7) {
            (this->queue).storage.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = piVar7;
          }
        }
        sVar5 = 0;
      }
      (this->queue).m_offset = sVar5;
    }
    else {
      this->markerOffset = this->markerOffset + this->numToConsume;
    }
    this->numToConsume = 0;
  }
  if (((long)(this->queue).storage.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(this->queue).storage.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start >> 2) - (this->queue).m_offset <
      (ulong)(this->markerOffset + amount)) {
    do {
      iVar3 = (*this->_vptr_InputBuffer[5])(this);
      uStack_28 = CONCAT44(iVar3,(undefined4)uStack_28);
      __position._M_current =
           (this->queue).storage.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->queue).storage.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->queue,__position,
                   (int *)((long)&uStack_28 + 4));
      }
      else {
        *__position._M_current = iVar3;
        (this->queue).storage.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
    } while (((long)(this->queue).storage.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->queue).storage.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2) - (this->queue).m_offset <
             (ulong)(this->markerOffset + amount));
  }
  return;
}

Assistant:

void InputBuffer::fill(unsigned int amount)
{
	syncConsume();

	// Fill the buffer sufficiently to hold needed characters
	while (queue.entries() < amount + markerOffset)
        {         
            // Append the next character
            queue.append(getChar());            
	}
}